

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int map_add(wally_map *map_in,uchar *key,size_t key_len,uchar *value,size_t value_len,
           _Bool take_value,_func_int_uchar_ptr_size_t *check_fn,_Bool ignore_dups)

{
  _Bool _Var1;
  int iVar2;
  wally_map_item *dst;
  size_t local_38;
  
  if (key_len == 0 || (key == (uchar *)0x0 || map_in == (wally_map *)0x0)) {
    return -2;
  }
  if ((check_fn != (_func_int_uchar_ptr_size_t *)0x0) &&
     (iVar2 = (*check_fn)(key,key_len), iVar2 != 0)) {
    return -2;
  }
  if ((value != (uchar *)0x0) == (value_len == 0)) {
    return -2;
  }
  iVar2 = wally_map_find(map_in,key,key_len,&local_38);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (local_38 != 0) {
    if (take_value && ignore_dups) {
      clear_and_free(value,value_len);
      return 0;
    }
    return (uint)ignore_dups * 2 + -2;
  }
  iVar2 = array_grow(&map_in->items,map_in->num_items,&map_in->items_allocation_len,0x20);
  if (iVar2 != 0) {
    return iVar2;
  }
  dst = map_in->items + map_in->num_items;
  _Var1 = clone_bytes(&dst->key,key,key_len);
  if (_Var1) {
    if (value != (uchar *)0x0) {
      if (take_value) {
        dst->value = value;
      }
      else {
        _Var1 = clone_bytes(&dst->value,value,value_len);
        if (!_Var1) {
          clear_and_free(dst->key,key_len);
          dst->key = (uchar *)0x0;
          goto LAB_0016d970;
        }
      }
    }
    dst->key_len = key_len;
    dst->value_len = value_len;
    map_in->num_items = map_in->num_items + 1;
    iVar2 = 0;
  }
  else {
LAB_0016d970:
    iVar2 = -3;
  }
  return iVar2;
}

Assistant:

static int map_add(struct wally_map *map_in,
                   const unsigned char *key, size_t key_len,
                   const unsigned char *value, size_t value_len,
                   bool take_value,
                   int (*check_fn)(const unsigned char *key, size_t key_len),
                   bool ignore_dups)
{
    size_t is_found;
    int ret;

    if (!map_in || !key || BYTES_INVALID(key, key_len) ||
        (check_fn && check_fn(key, key_len) != WALLY_OK) ||
        BYTES_INVALID(value, value_len))
        return WALLY_EINVAL;

    if ((ret = wally_map_find(map_in, key, key_len, &is_found)) != WALLY_OK)
        return ret;

    if (is_found) {
        if (ignore_dups && take_value)
            clear_and_free((unsigned char *)value, value_len);
        return ignore_dups ? WALLY_OK : WALLY_EINVAL;
    }

    ret = array_grow((void *)&map_in->items, map_in->num_items,
                     &map_in->items_allocation_len, sizeof(struct wally_map_item));
    if (ret == WALLY_OK) {
        struct wally_map_item *new_item = map_in->items + map_in->num_items;

        if (!clone_bytes(&new_item->key, key, key_len))
            return WALLY_ENOMEM;
        if (value) {
            if (take_value)
                new_item->value = (unsigned char *)value;
            else if (!clone_bytes(&new_item->value, value, value_len)) {
                clear_and_free(new_item->key, key_len);
                new_item->key = NULL;
                return WALLY_ENOMEM;
            }
        }
        new_item->key_len = key_len;
        new_item->value_len = value_len;
        map_in->num_items++;
    }
    return ret;
}